

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void DeviceZXSpectrum2048(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *this;
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  
  this = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(this,"ZXSPECTRUM2048",parent);
  *dev = this;
  initZxLikeDevice(*dev,0x4000,0x80,initialPagesZx128,ramtop);
  return;
}

Assistant:

static void DeviceZXSpectrum2048(CDevice **dev, CDevice *parent, aint ramtop) {
	*dev = new CDevice("ZXSPECTRUM2048", parent);
	initZxLikeDevice(*dev, 0x4000, 128, initialPagesZx128, ramtop);
}